

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

sarimax_object sarimax_init(int p,int d,int q,int P,int D,int Q,int s,int r,int imean,int N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  sarimax_object psVar6;
  sarimax_object psVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char *__s;
  int iVar11;
  int iVar12;
  long lVar13;
  
  iVar11 = 0;
  if (D + P + Q != 0) {
    iVar11 = s;
  }
  if ((uint)imean < 2) {
    if ((-1 < (q | P | d | p | D | Q)) && (0 < N)) {
      iVar2 = (uint)((D + d == 0 || SCARRY4(D,d) != D + d < 0) && imean != 0) + r;
      iVar3 = q + p + P;
      iVar4 = iVar3 + Q;
      iVar5 = iVar4 + iVar2;
      iVar12 = N - (iVar11 * D + d);
      iVar1 = iVar12 + iVar5;
      lVar13 = (long)iVar5;
      psVar6 = (sarimax_object)malloc((lVar13 * lVar13 + (long)iVar1) * 8 + 0xa8);
      psVar6->p = p;
      psVar6->d = d;
      psVar6->q = q;
      psVar6->N = N;
      psVar6->s = iVar11;
      psVar6->P = P;
      psVar6->D = D;
      psVar6->Q = Q;
      psVar6->Nused = iVar12;
      psVar6->M = iVar2;
      psVar6->r = r;
      psVar6->retval = 0;
      psVar6->start = 0;
      psVar6->imean = imean;
      uVar8 = iVar5 * iVar5 + iVar1;
      psVar7 = psVar6 + 1;
      uVar10 = 0;
      uVar9 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 * 8 != uVar10; uVar10 = uVar10 + 8) {
        *(undefined8 *)((long)&psVar6[1].N + uVar10) = 0;
      }
      psVar6->phi = (double *)psVar7;
      psVar6->theta = (double *)(&psVar7->N + (ulong)(uint)p * 2);
      psVar6->PHI = (double *)(&psVar7->N + (long)(q + p) * 2);
      psVar6->THETA = (double *)(&psVar7->N + (long)iVar3 * 2);
      psVar6->exog = (double *)(&psVar7->N + (long)iVar4 * 2);
      psVar6->res = (double *)(&psVar7->N + lVar13 * 2);
      psVar6->vcov = (double *)(&psVar7->N + (long)iVar1 * 2);
      psVar6->method = 0;
      psVar6->optmethod = 5;
      psVar6->mean = 0.0;
      psVar6->var = 1.0;
      psVar6->lvcov = iVar5 * iVar5;
      psVar6->ncoeff = iVar5;
      return psVar6;
    }
    __s = "\n Input Values cannot be Negative. Program Exiting. ";
  }
  else {
    __s = "imean only accepts one of two values - 0 and 1 ";
  }
  puts(__s);
  exit(-1);
}

Assistant:

sarimax_object sarimax_init(int p, int d, int q,int P, int D, int Q,int s, int r,int imean, int N) {
	sarimax_object obj = NULL;
	int i,ncxreg;
	if (P + D + Q == 0) {
		s = 0;
	}

	if (imean < 0 || imean > 1) {
		printf("imean only accepts one of two values - 0 and 1 \n");
		exit(-1);
	}

	if (d + D > 0) {
		ncxreg = r;
	}
	else {
		if (imean == 0) {
			ncxreg = r;
		} else {
			ncxreg = 1 + r;
		}
	}
	if (p < 0 || d < 0 || q < 0 || N <= 0 || P < 0 || D < 0 || Q < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}
	/*
	Error Codes
	retval = 0 Input Error
	retval = 1 Probable Success
	retval = 4 Optimization Routine didn't converge
	retval = 7 Exogenous Variables are collinear
	retval = 10 Nonstationary AR part
	retavl = 12 Nonstationary Seasonal AR part
	retval = 15 Optimization Routine Encountered Inf/Nan Values

	*/
	
	obj = (sarimax_object)malloc(sizeof(struct sarimax_set) +
	 sizeof(double)* (p + q + P + Q + ncxreg + N - d - s*D) + sizeof(double)* (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg ));

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->Nused = N - d - s*D;
	obj->M = ncxreg;
	obj->r = r;
	obj->retval = 0;
	obj->start = 0;
	obj->imean = imean;

	for (i = 0; i < (p + q + P + Q + ncxreg + N - d - s*D) + (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg ); ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->PHI = &obj->params[p + q];
	obj->THETA = &obj->params[p + q + P];
	obj->exog = &obj->params[p + q + P + Q];
	obj->res = &obj->params[p + q + P + Q + ncxreg];
	obj->vcov = &obj->params[p + q + P + Q + ncxreg + N - d - s*D];


	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg );
	obj->ncoeff = p + q + P + Q + ncxreg ;

	return obj;
}